

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Copper.cpp
# Opt level: O2

bool __thiscall Amiga::Copper::advance_dma(Copper *this,uint16_t position,uint16_t blitter_status)

{
  ushort uVar1;
  bool bVar2;
  bool bVar3;
  ushort uVar4;
  uint uVar5;
  State SVar6;
  
  SVar6 = this->state_;
  if (SVar6 == FetchFirstWord) {
    this->instruction_[0] =
         (this->super_DMADevice<2UL,_0UL>).super_DMADeviceBase.ram_
         [(this->super_DMADevice<2UL,_0UL>).super_DMADeviceBase.ram_mask_ & this->address_];
    this->address_ = this->address_ + 1;
    SVar6 = FetchSecondWord;
  }
  else {
    if (SVar6 != FetchSecondWord) {
      if (SVar6 != Waiting) {
        return false;
      }
      bVar2 = anon_unknown.dwarf_6db1e6::satisfies_raster
                        (position,blitter_status,this->instruction_);
      SVar6 = FetchFirstWord;
      bVar3 = false;
      if (!bVar2) {
        return false;
      }
      goto LAB_00247130;
    }
    bVar2 = this->skip_next_;
    this->skip_next_ = false;
    uVar5 = this->address_;
    uVar1 = (this->super_DMADevice<2UL,_0UL>).super_DMADeviceBase.ram_
            [(this->super_DMADevice<2UL,_0UL>).super_DMADeviceBase.ram_mask_ & uVar5];
    this->instruction_[1] = uVar1;
    this->address_ = uVar5 + 1;
    bVar3 = true;
    if ((this->instruction_[0] & 1) == 0) {
      SVar6 = FetchFirstWord;
      if (bVar2 == false) {
        uVar5 = this->instruction_[0] & 0x1fe;
        uVar4 = (ushort)uVar5;
        this->instruction_[0] = uVar4;
        if ((uVar4 < 0x10) || ((uVar4 < 0x20 && ((this->control_ & 1) == 0)))) {
          SVar6 = Stopped;
        }
        else {
          Chipset::write((this->super_DMADevice<2UL,_0UL>).super_DMADeviceBase.chipset_,uVar5,
                         (void *)(ulong)uVar1,1);
        }
      }
      goto LAB_00247130;
    }
    if ((uVar1 & 1) != 0) {
      bVar2 = anon_unknown.dwarf_6db1e6::satisfies_raster
                        (position,blitter_status,this->instruction_);
      this->skip_next_ = bVar2;
      SVar6 = FetchFirstWord;
      goto LAB_00247130;
    }
    SVar6 = Waiting;
  }
  bVar3 = true;
LAB_00247130:
  this->state_ = SVar6;
  return bVar3;
}

Assistant:

bool Copper::advance_dma(uint16_t position, uint16_t blitter_status) {
	switch(state_) {
		default: return false;

		case State::Waiting:
			if(satisfies_raster(position, blitter_status, instruction_)) {
				logger.info().append("Unblocked waiting for %04x at %04x with mask %04x", instruction_[0], position, instruction_[1] & 0x7ffe);
				state_ = State::FetchFirstWord;
			}
		return false;

		case State::FetchFirstWord:
			instruction_[0] = ram_[address_ & ram_mask_];
			++address_;
			state_ = State::FetchSecondWord;
			logger.info().append("First word fetch at %04x", position);
		break;

		case State::FetchSecondWord: {
			// Get and reset the should-skip-next flag.
			const bool should_skip_move = skip_next_;
			skip_next_ = false;

			// Read in the second instruction word.
			instruction_[1] = ram_[address_ & ram_mask_];
			++address_;
			logger.info().append("Second word fetch at %04x", position);

			// Check for a MOVE.
			if(!(instruction_[0] & 1)) {
				if(!should_skip_move) {
					// Stop if this move would be a privilege violation.
					instruction_[0] &= 0x1fe;
					if((instruction_[0] < 0x10) || (instruction_[0] < 0x20 && !(control_&1))) {
						logger.info().append("Invalid MOVE to %04x; stopping", instruction_[0]);
						state_ = State::Stopped;
						break;
					}

					chipset_.write(instruction_[0], instruction_[1]);
				}

				// Roll onto the next command.
				state_ = State::FetchFirstWord;
				break;
			}

			// Got to here => this is a WAIT or a SKIP.

			if(!(instruction_[1] & 1)) {
				// A WAIT. The wait-for-start-of-next PAL wait of
				// $FFDF,$FFFE seems to suggest evaluation will happen
				// in the next cycle rather than this one.
				state_ = State::Waiting;
				break;
			}

			// Neither a WAIT nor a MOVE => a SKIP.

			skip_next_ = satisfies_raster(position, blitter_status, instruction_);
			state_ = State::FetchFirstWord;
		} break;
	}

	return true;
}